

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

void google::ShowXMLOfFlags(char *prog_name)

{
  FILE *pFVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 uVar4;
  pointer pCVar5;
  reference flag_00;
  google local_100 [32];
  __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_e0;
  __normal_iterator<google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_d8;
  __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
  local_d0;
  const_iterator flag;
  string local_c0 [32];
  google local_a0 [39];
  allocator local_79;
  string local_78 [32];
  google local_58 [48];
  undefined1 local_28 [8];
  vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> flags;
  char *prog_name_local;
  
  flags.
  super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)prog_name;
  std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::vector
            ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
             local_28);
  GetAllFlags((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
              local_28);
  fprintf(_stdout,"<?xml version=\"1.0\"?>\n");
  fprintf(_stdout,"<AllFlags>\n");
  pFVar1 = _stdout;
  pcVar3 = Basename((char *)flags.
                            super__Vector_base<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar3,&local_79);
  XMLText(local_58,(string *)local_78);
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"<program>%s</program>\n",uVar4);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pFVar1 = _stdout;
  pcVar3 = ProgramUsage();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,pcVar3,(allocator *)((long)&flag._M_current + 7));
  XMLText(local_a0,(string *)local_c0);
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"<usage>%s</usage>\n",uVar4);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&flag._M_current + 7));
  local_d8._M_current =
       (CommandLineFlagInfo *)
       std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::begin
                 ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                   *)local_28);
  __gnu_cxx::
  __normal_iterator<google::CommandLineFlagInfo_const*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>
  ::__normal_iterator<google::CommandLineFlagInfo*>
            ((__normal_iterator<google::CommandLineFlagInfo_const*,std::vector<google::CommandLineFlagInfo,std::allocator<google::CommandLineFlagInfo>>>
              *)&local_d0,&local_d8);
  while( true ) {
    local_e0._M_current =
         (CommandLineFlagInfo *)
         std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::end
                   ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>
                     *)local_28);
    bVar2 = __gnu_cxx::operator!=(&local_d0,&local_e0);
    if (!bVar2) break;
    pCVar5 = __gnu_cxx::
             __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
             ::operator->(&local_d0);
    bVar2 = std::operator!=(&pCVar5->description,kStrippedFlagHelp);
    pFVar1 = _stdout;
    if (bVar2) {
      flag_00 = __gnu_cxx::
                __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
                ::operator*(&local_d0);
      DescribeOneFlagInXML_abi_cxx11_(local_100,flag_00);
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s\n",uVar4);
      std::__cxx11::string::~string((string *)local_100);
    }
    __gnu_cxx::
    __normal_iterator<const_google::CommandLineFlagInfo_*,_std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>_>
    ::operator++(&local_d0);
  }
  fprintf(_stdout,"</AllFlags>\n");
  std::vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_>::~vector
            ((vector<google::CommandLineFlagInfo,_std::allocator<google::CommandLineFlagInfo>_> *)
             local_28);
  return;
}

Assistant:

static void ShowXMLOfFlags(const char *prog_name) {
  vector<CommandLineFlagInfo> flags;
  GetAllFlags(&flags);   // flags are sorted: by filename, then flagname

  // XML.  There is no corresponding schema yet
  fprintf(stdout, "<?xml version=\"1.0\"?>\n");
  // The document
  fprintf(stdout, "<AllFlags>\n");
  // the program name and usage
  fprintf(stdout, "<program>%s</program>\n",
          XMLText(Basename(prog_name)).c_str());
  fprintf(stdout, "<usage>%s</usage>\n",
          XMLText(ProgramUsage()).c_str());
  // All the flags
  for (vector<CommandLineFlagInfo>::const_iterator flag = flags.begin();
       flag != flags.end();
       ++flag) {
    if (flag->description != kStrippedFlagHelp)
      fprintf(stdout, "%s\n", DescribeOneFlagInXML(*flag).c_str());
  }
  // The end of the document
  fprintf(stdout, "</AllFlags>\n");
}